

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int statement(void)

{
  int iVar1;
  undefined4 local_4;
  
  iVar1 = compound_statement();
  if (iVar1 == 0) {
    iVar1 = jump_statement();
    if (iVar1 == 0) {
      iVar1 = expression_statement();
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int statement()
{
    if (compound_statement())
        return 1;
    else if (jump_statement())
        return 1;
    /* expression_statement() has to be the last in the list, as in case of
       error it will try to resync on a ";" and yield true if synced, making the
       statement an empty statement and allowing the parsing to continue */
    else if (expression_statement())
        return 1;

    return 0;
}